

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

int sve_exception_el_aarch64(CPUARMState_conflict *env,int el)

{
  bool bVar1;
  _Bool _Var2;
  uint32_t uVar3;
  int iVar4;
  uint64_t uVar5;
  bool local_29;
  _Bool disabled;
  uint64_t hcr_el2;
  int el_local;
  CPUARMState_conflict *env_local;
  
  uVar5 = arm_hcr_el2_eff_aarch64(env);
  if ((el < 2) && ((uVar5 & 0x408000000) != 0x408000000)) {
    uVar3 = extract32((uint32_t)(env->cp15).cpacr_el1,0x10,1);
    if (uVar3 == 0) {
      local_29 = true;
    }
    else {
      uVar3 = extract32((uint32_t)(env->cp15).cpacr_el1,0x11,1);
      local_29 = uVar3 == 0 && el == 0;
    }
    if (local_29) {
      if ((uVar5 & 0x8000000) == 0) {
        return 1;
      }
      return 2;
    }
    uVar3 = extract32((uint32_t)(env->cp15).cpacr_el1,0x14,1);
    if (uVar3 == 0) {
      bVar1 = true;
    }
    else {
      uVar3 = extract32((uint32_t)(env->cp15).cpacr_el1,0x15,1);
      bVar1 = uVar3 == 0 && el == 0;
    }
    if (bVar1) {
      return 0;
    }
  }
  if ((el < 3) && (_Var2 = arm_is_secure_below_el3(env), !_Var2)) {
    if (((env->cp15).cptr_el[2] & 0x100) != 0) {
      return 2;
    }
    if (((env->cp15).cptr_el[2] & 0x400) != 0) {
      return 0;
    }
  }
  iVar4 = arm_feature(env,0x21);
  if ((iVar4 == 0) || (((env->cp15).cptr_el[3] & 0x100) != 0)) {
    env_local._4_4_ = 0;
  }
  else {
    env_local._4_4_ = 3;
  }
  return env_local._4_4_;
}

Assistant:

int sve_exception_el(CPUARMState *env, int el)
{
    uint64_t hcr_el2 = arm_hcr_el2_eff(env);

    if (el <= 1 && (hcr_el2 & (HCR_E2H | HCR_TGE)) != (HCR_E2H | HCR_TGE)) {
        bool disabled = false;

        /* The CPACR.ZEN controls traps to EL1:
         * 0, 2 : trap EL0 and EL1 accesses
         * 1    : trap only EL0 accesses
         * 3    : trap no accesses
         */
        if (!extract32(env->cp15.cpacr_el1, 16, 1)) {
            disabled = true;
        } else if (!extract32(env->cp15.cpacr_el1, 17, 1)) {
            disabled = el == 0;
        }
        if (disabled) {
            /* route_to_el2 */
            return hcr_el2 & HCR_TGE ? 2 : 1;
        }

        /* Check CPACR.FPEN.  */
        if (!extract32(env->cp15.cpacr_el1, 20, 1)) {
            disabled = true;
        } else if (!extract32(env->cp15.cpacr_el1, 21, 1)) {
            disabled = el == 0;
        }
        if (disabled) {
            return 0;
        }
    }

    /* CPTR_EL2.  Since TZ and TFP are positive,
     * they will be zero when EL2 is not present.
     */
    if (el <= 2 && !arm_is_secure_below_el3(env)) {
        if (env->cp15.cptr_el[2] & CPTR_TZ) {
            return 2;
        }
        if (env->cp15.cptr_el[2] & CPTR_TFP) {
            return 0;
        }
    }

    /* CPTR_EL3.  Since EZ is negative we must check for EL3.  */
    if (arm_feature(env, ARM_FEATURE_EL3)
        && !(env->cp15.cptr_el[3] & CPTR_EZ)) {
        return 3;
    }
    return 0;
}